

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.c
# Opt level: O2

double UnifReal(double dLow,double dHigh,long nStream)

{
  long lVar1;
  long lVar2;
  double dVar3;
  
  if ((dLow == dHigh) && (!NAN(dLow) && !NAN(dHigh))) {
    return dLow;
  }
  lVar2 = 0;
  if ((ulong)nStream < 0x32) {
    lVar2 = nStream;
  }
  dVar3 = dLow;
  if (dLow <= dHigh) {
    dVar3 = dHigh;
    dHigh = dLow;
  }
  lVar1 = NextRand(Seed[lVar2].value);
  Seed[lVar2].value = lVar1;
  return (dVar3 - dHigh) * ((double)lVar1 / 2147483647.0) + dHigh;
}

Assistant:

double
UnifReal(double dLow, double dHigh, long nStream)

/*
 * Returns a double uniformly distributed between dLow and dHigh,   
 * excluding the endpoints.  nStream is the random number stream.   
 * Stream 0 is used if nStream is not in the range 0..MAX_STREAM.
 */

{
    double          dTemp;

    if (nStream < 0 || nStream > MAX_STREAM)
        nStream = 0;
    if (dLow == dHigh)
        return (dLow);
    if (dLow > dHigh)
    {
        dTemp = dLow;
        dLow = dHigh;
        dHigh = dTemp;
    }
    Seed[nStream].value = NextRand(Seed[nStream].value);
    dTemp = ((double) Seed[nStream].value / dM) * (dHigh - dLow);
    return (dLow + dTemp);
}